

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_link_resolver.c
# Opt level: O1

void test_link_resolver(void)

{
  archive_entry_linkresolver *paVar1;
  la_int64_t lVar2;
  char *pcVar3;
  archive_entry *e2;
  archive_entry_linkresolver *local_40;
  archive_entry *entry;
  
  paVar1 = archive_entry_linkresolver_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'!',(uint)(paVar1 != (archive_entry_linkresolver *)0x0),
                   "NULL != (resolver = archive_entry_linkresolver_new())",(void *)0x0);
  archive_entry_linkresolver_set_strategy(paVar1,0x30001);
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'&',(uint)(entry != (archive_entry *)0x0),
                   "NULL != (entry = archive_entry_new())",(void *)0x0);
  archive_entry_set_pathname(entry,"test1");
  archive_entry_set_ino(entry,1);
  archive_entry_set_dev(entry,2);
  archive_entry_set_nlink(entry,1);
  archive_entry_set_size(entry,10);
  archive_entry_linkify(paVar1,&entry,&e2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'/',(uint)(e2 == (archive_entry *)0x0),"e2 == NULL",(void *)0x0);
  lVar2 = archive_entry_size(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                      ,L'0',10,"10",lVar2,"archive_entry_size(entry)",(void *)0x0);
  pcVar3 = archive_entry_pathname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'1',"test1","\"test1\"",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,L'\0');
  archive_entry_set_pathname(entry,"test2");
  archive_entry_set_nlink(entry,2);
  archive_entry_set_ino(entry,2);
  local_40 = paVar1;
  archive_entry_linkify(paVar1,&entry,&e2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'9',(uint)(e2 == (archive_entry *)0x0),"e2 == NULL",(void *)0x0);
  pcVar3 = archive_entry_pathname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L':',"test2","\"test2\"",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,L'\0');
  pcVar3 = archive_entry_hardlink(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L';',(char *)0x0,"NULL",pcVar3,"archive_entry_hardlink(entry)",(void *)0x0,L'\0');
  lVar2 = archive_entry_size(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                      ,L'<',10,"10",lVar2,"archive_entry_size(entry)",(void *)0x0);
  archive_entry_linkify(paVar1,&entry,&e2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'@',(uint)(e2 == (archive_entry *)0x0),"e2 == NULL",(void *)0x0);
  pcVar3 = archive_entry_pathname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'A',"test2","\"test2\"",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,L'\0');
  pcVar3 = archive_entry_hardlink(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'B',"test2","\"test2\"",pcVar3,"archive_entry_hardlink(entry)",(void *)0x0,L'\0');
  lVar2 = archive_entry_size(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                      ,L'C',0,"0",lVar2,"archive_entry_size(entry)",(void *)0x0);
  archive_entry_set_pathname(entry,"test3");
  archive_entry_set_nlink(entry,2);
  archive_entry_set_filetype(entry,0x4000);
  archive_entry_set_ino(entry,3);
  archive_entry_set_hardlink(entry,(char *)0x0);
  paVar1 = local_40;
  archive_entry_linkify(local_40,&entry,&e2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'N',(uint)(e2 == (archive_entry *)0x0),"e2 == NULL",(void *)0x0);
  pcVar3 = archive_entry_pathname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'O',"test3","\"test3\"",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,L'\0');
  pcVar3 = archive_entry_hardlink(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'P',(char *)0x0,"NULL",pcVar3,"archive_entry_hardlink(entry)",(void *)0x0,L'\0');
  archive_entry_linkify(paVar1,&entry,&e2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'T',(uint)(e2 == (archive_entry *)0x0),"e2 == NULL",(void *)0x0);
  pcVar3 = archive_entry_pathname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'U',"test3","\"test3\"",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,L'\0');
  pcVar3 = archive_entry_hardlink(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'V',(char *)0x0,"NULL",pcVar3,"archive_entry_hardlink(entry)",(void *)0x0,L'\0');
  archive_entry_free(entry);
  archive_entry_linkresolver_free(local_40);
  paVar1 = archive_entry_linkresolver_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'b',(uint)(paVar1 != (archive_entry_linkresolver *)0x0),
                   "NULL != (resolver = archive_entry_linkresolver_new())",(void *)0x0);
  archive_entry_linkresolver_set_strategy(paVar1,0x10001);
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'g',(uint)(entry != (archive_entry *)0x0),
                   "NULL != (entry = archive_entry_new())",(void *)0x0);
  archive_entry_set_pathname(entry,"test1");
  archive_entry_set_ino(entry,1);
  archive_entry_set_dev(entry,2);
  archive_entry_set_nlink(entry,2);
  archive_entry_set_size(entry,10);
  archive_entry_linkify(paVar1,&entry,&e2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'p',(uint)(e2 == (archive_entry *)0x0),"e2 == NULL",(void *)0x0);
  lVar2 = archive_entry_size(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                      ,L'q',10,"10",lVar2,"archive_entry_size(entry)",(void *)0x0);
  pcVar3 = archive_entry_pathname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'r',"test1","\"test1\"",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,L'\0');
  archive_entry_linkify(paVar1,&entry,&e2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'v',(uint)(e2 == (archive_entry *)0x0),"e2 == NULL",(void *)0x0);
  pcVar3 = archive_entry_pathname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'w',"test1","\"test1\"",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,L'\0');
  pcVar3 = archive_entry_hardlink(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'x',(char *)0x0,"NULL",pcVar3,"archive_entry_hardlink(entry)",(void *)0x0,L'\0');
  lVar2 = archive_entry_size(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                      ,L'y',10,"10",lVar2,"archive_entry_size(entry)",(void *)0x0);
  archive_entry_free(entry);
  archive_entry_linkresolver_free(paVar1);
  paVar1 = archive_entry_linkresolver_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'\x85',(uint)(paVar1 != (archive_entry_linkresolver *)0x0),
                   "NULL != (resolver = archive_entry_linkresolver_new())",(void *)0x0);
  archive_entry_linkresolver_set_strategy(paVar1,0x10004);
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'\x8a',(uint)(entry != (archive_entry *)0x0),
                   "NULL != (entry = archive_entry_new())",(void *)0x0);
  archive_entry_set_pathname(entry,"test1");
  archive_entry_set_ino(entry,1);
  archive_entry_set_dev(entry,2);
  archive_entry_set_nlink(entry,1);
  archive_entry_set_size(entry,10);
  archive_entry_linkify(paVar1,&entry,&e2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'\x93',(uint)(e2 == (archive_entry *)0x0),"e2 == NULL",(void *)0x0);
  lVar2 = archive_entry_size(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                      ,L'\x94',10,"10",lVar2,"archive_entry_size(entry)",(void *)0x0);
  pcVar3 = archive_entry_pathname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'\x95',"test1","\"test1\"",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,L'\0');
  archive_entry_set_pathname(entry,"test2");
  archive_entry_set_nlink(entry,3);
  archive_entry_set_ino(entry,2);
  archive_entry_linkify(paVar1,&entry,&e2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'\x9e',(uint)(entry == (archive_entry *)0x0),"entry == NULL",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'\x9f',(uint)(e2 == (archive_entry *)0x0),"e2 == NULL",(void *)0x0);
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'¢',(uint)(entry != (archive_entry *)0x0),
                   "NULL != (entry = archive_entry_new())",(void *)0x0);
  archive_entry_set_pathname(entry,"test3");
  archive_entry_set_ino(entry,2);
  archive_entry_set_dev(entry,2);
  archive_entry_set_nlink(entry,2);
  archive_entry_set_size(entry,10);
  archive_entry_linkify(paVar1,&entry,&e2);
  pcVar3 = archive_entry_pathname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'«',"test2","\"test2\"",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,L'\0');
  lVar2 = archive_entry_size(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                      ,L'¬',0,"0",lVar2,"archive_entry_size(entry)",(void *)0x0);
  archive_entry_free(entry);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'®',(uint)(e2 == (archive_entry *)0x0),"NULL == e2",(void *)0x0);
  archive_entry_free(e2);
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'²',(uint)(entry != (archive_entry *)0x0),
                   "NULL != (entry = archive_entry_new())",(void *)0x0);
  archive_entry_set_pathname(entry,"test4");
  archive_entry_set_ino(entry,2);
  archive_entry_set_dev(entry,2);
  archive_entry_set_nlink(entry,3);
  archive_entry_set_size(entry,10);
  archive_entry_linkify(paVar1,&entry,&e2);
  pcVar3 = archive_entry_pathname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'»',"test3","\"test3\"",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,L'\0');
  lVar2 = archive_entry_size(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                      ,L'¼',0,"0",lVar2,"archive_entry_size(entry)",(void *)0x0);
  pcVar3 = archive_entry_pathname(e2);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'¿',"test4","\"test4\"",pcVar3,"archive_entry_pathname(e2)",(void *)0x0,L'\0');
  lVar2 = archive_entry_size(e2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_link_resolver.c"
                      ,L'À',10,"10",lVar2,"archive_entry_size(e2)",(void *)0x0);
  archive_entry_free(entry);
  archive_entry_free(e2);
  archive_entry_linkresolver_free(paVar1);
  return;
}

Assistant:

static void test_linkify_tar(void)
{
	struct archive_entry *entry, *e2;
	struct archive_entry_linkresolver *resolver;

	/* Initialize the resolver. */
	assert(NULL != (resolver = archive_entry_linkresolver_new()));
	archive_entry_linkresolver_set_strategy(resolver,
	    ARCHIVE_FORMAT_TAR_USTAR);

	/* Create an entry with only 1 link and try to linkify it. */
	assert(NULL != (entry = archive_entry_new()));
	archive_entry_set_pathname(entry, "test1");
	archive_entry_set_ino(entry, 1);
	archive_entry_set_dev(entry, 2);
	archive_entry_set_nlink(entry, 1);
	archive_entry_set_size(entry, 10);
	archive_entry_linkify(resolver, &entry, &e2);

	/* Shouldn't have been changed. */
	assert(e2 == NULL);
	assertEqualInt(10, archive_entry_size(entry));
	assertEqualString("test1", archive_entry_pathname(entry));

	/* Now, try again with an entry that has 2 links. */
	archive_entry_set_pathname(entry, "test2");
	archive_entry_set_nlink(entry, 2);
	archive_entry_set_ino(entry, 2);
	archive_entry_linkify(resolver, &entry, &e2);
	/* Shouldn't be altered, since it wasn't seen before. */
	assert(e2 == NULL);
	assertEqualString("test2", archive_entry_pathname(entry));
	assertEqualString(NULL, archive_entry_hardlink(entry));
	assertEqualInt(10, archive_entry_size(entry));

	/* Match again and make sure it does get altered. */
	archive_entry_linkify(resolver, &entry, &e2);
	assert(e2 == NULL);
	assertEqualString("test2", archive_entry_pathname(entry));
	assertEqualString("test2", archive_entry_hardlink(entry));
	assertEqualInt(0, archive_entry_size(entry));


	/* Dirs should never be matched as hardlinks, regardless. */
	archive_entry_set_pathname(entry, "test3");
	archive_entry_set_nlink(entry, 2);
	archive_entry_set_filetype(entry, AE_IFDIR);
	archive_entry_set_ino(entry, 3);
	archive_entry_set_hardlink(entry, NULL);
	archive_entry_linkify(resolver, &entry, &e2);
	/* Shouldn't be altered, since it wasn't seen before. */
	assert(e2 == NULL);
	assertEqualString("test3", archive_entry_pathname(entry));
	assertEqualString(NULL, archive_entry_hardlink(entry));

	/* Dir, so it shouldn't get matched. */
	archive_entry_linkify(resolver, &entry, &e2);
	assert(e2 == NULL);
	assertEqualString("test3", archive_entry_pathname(entry));
	assertEqualString(NULL, archive_entry_hardlink(entry));

	archive_entry_free(entry);
	archive_entry_linkresolver_free(resolver);
}